

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O2

sg_buffer sg_make_buffer(sg_buffer_desc *desc)

{
  sg_buffer buf_id;
  long lVar1;
  sg_buffer_desc *psVar2;
  sg_usage sVar3;
  sg_buffer_desc def;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                  ,0x3ae7,"sg_buffer sg_make_buffer(const sg_buffer_desc *)");
  }
  if (desc != (sg_buffer_desc *)0x0) {
    psVar2 = &def;
    for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)psVar2 = *(undefined8 *)desc;
      desc = (sg_buffer_desc *)&desc->size;
      psVar2 = (sg_buffer_desc *)((long)psVar2 + 8);
    }
    sVar3 = def.usage;
    def.type = def.type + (uint)(def.type == _SG_BUFFERTYPE_DEFAULT);
    def.usage = sVar3 + (sVar3 == _SG_USAGE_DEFAULT);
    if (def.size == 0) {
      def.size = def.data.size;
    }
    else if (def.data.size == 0) {
      def.data.size = def.size;
    }
    buf_id = _sg_alloc_buffer();
    if (buf_id.id == 0) {
      puts("buffer pool exhausted!");
    }
    else {
      _sg_init_buffer(buf_id,&def);
    }
    return (sg_buffer)buf_id.id;
  }
  __assert_fail("desc",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                ,0x3ae8,"sg_buffer sg_make_buffer(const sg_buffer_desc *)");
}

Assistant:

inline sg_buffer sg_make_buffer(const sg_buffer_desc& desc) { return sg_make_buffer(&desc); }